

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O3

void __thiscall cmCursesMainForm::RePost(cmCursesMainForm *this)

{
  pointer *pppfVar1;
  FORM *form;
  pointer ppfVar2;
  __uniq_ptr_data<cmState,_std::default_delete<cmState>,_true,_true> _Var3;
  bool bVar4;
  size_t sVar5;
  char *pcVar6;
  cmValue cVar7;
  FIELD **ppFVar8;
  fieldnode **__args;
  fieldnode **ppfVar9;
  size_type __n;
  iterator iVar10;
  cmCursesCacheEntryComposite *entry;
  pointer pcVar11;
  cmCursesCacheEntryComposite *entry_1;
  allocator<char> local_89;
  vector<fieldnode*,std::allocator<fieldnode*>> *local_88;
  string local_80;
  string local_60;
  pointer local_40;
  size_t *local_38;
  
  form = (this->super_cmCursesForm).Form;
  if (form != (FORM *)0x0) {
    unpost_form(form);
    free_form((this->super_cmCursesForm).Form);
    (this->super_cmCursesForm).Form = (FORM *)0x0;
  }
  ppfVar2 = (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppfVar2) {
    (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppfVar2;
  }
  if (this->AdvancedMode == true) {
    sVar5 = (long)(this->Entries).
                  super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->Entries).
                  super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 6;
    this->NumberOfVisibleEntries = sVar5;
LAB_001574ee:
    if (sVar5 != 0) {
      __n = sVar5 * 3 + 1;
      goto LAB_00157520;
    }
  }
  else {
    this->NumberOfVisibleEntries = 0;
    pcVar11 = (this->Entries).
              super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_40 = (this->Entries).
               super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (pcVar11 != local_40) {
      do {
        _Var3.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
        super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
             (((this->CMakeInstance)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>.
               _M_t.super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
               super__Head_base<0UL,_cmake_*,_false>._M_head_impl)->State)._M_t.
             super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>;
        pcVar6 = cmCursesCacheEntryComposite::GetValue(pcVar11);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,pcVar6,(allocator<char> *)&local_60);
        cVar7 = cmState::GetCacheEntryValue
                          ((cmState *)
                           _Var3.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                           super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        _Var3.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
        super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
             (((this->CMakeInstance)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>.
               _M_t.super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
               super__Head_base<0UL,_cmake_*,_false>._M_head_impl)->State)._M_t.
             super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>;
        pcVar6 = cmCursesCacheEntryComposite::GetValue(pcVar11);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,pcVar6,&local_89);
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"ADVANCED","");
        bVar4 = cmState::GetCacheEntryPropertyAsBool
                          ((cmState *)
                           _Var3.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                           super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&local_80,&local_60)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if ((cVar7.Value != (string *)0x0) && ((!bVar4 || (this->AdvancedMode != false)))) {
          this->NumberOfVisibleEntries = this->NumberOfVisibleEntries + 1;
        }
        pcVar11 = pcVar11 + 1;
      } while (pcVar11 != local_40);
      sVar5 = this->NumberOfVisibleEntries;
      goto LAB_001574ee;
    }
  }
  this->NumberOfVisibleEntries = 1;
  __n = 4;
LAB_00157520:
  local_38 = &this->NumberOfVisibleEntries;
  local_88 = (vector<fieldnode*,std::allocator<fieldnode*>> *)&this->Fields;
  std::vector<fieldnode_*,_std::allocator<fieldnode_*>_>::reserve
            ((vector<fieldnode_*,_std::allocator<fieldnode_*>_> *)local_88,__n);
  pcVar11 = (this->Entries).
            super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_40 = (this->Entries).
             super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pcVar11 != local_40) {
    do {
      _Var3.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
      super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
           (((this->CMakeInstance)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>.
             _M_t.super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
             super__Head_base<0UL,_cmake_*,_false>._M_head_impl)->State)._M_t.
           super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>;
      pcVar6 = cmCursesCacheEntryComposite::GetValue(pcVar11);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,pcVar6,(allocator<char> *)&local_60);
      cVar7 = cmState::GetCacheEntryValue
                        ((cmState *)
                         _Var3.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                         super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                         super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      _Var3.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
      super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
           (((this->CMakeInstance)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>.
             _M_t.super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
             super__Head_base<0UL,_cmake_*,_false>._M_head_impl)->State)._M_t.
           super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>;
      pcVar6 = cmCursesCacheEntryComposite::GetValue(pcVar11);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,pcVar6,&local_89);
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"ADVANCED","");
      bVar4 = cmState::GetCacheEntryPropertyAsBool
                        ((cmState *)
                         _Var3.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                         super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                         super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&local_80,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if ((cVar7.Value != (string *)0x0) && ((!bVar4 || (this->AdvancedMode != false)))) {
        ppFVar8 = (FIELD **)
                  ((long)&((pcVar11->Label)._M_t.
                           super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>
                           .super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl)->
                          super_cmCursesWidget + 0x30);
        iVar10._M_current =
             (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar10._M_current ==
            (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<fieldnode*,std::allocator<fieldnode*>>::_M_realloc_insert<fieldnode*const&>
                    (local_88,iVar10,ppFVar8);
          iVar10._M_current =
               (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
        }
        else {
          *iVar10._M_current = *ppFVar8;
          iVar10._M_current =
               (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
          (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar10._M_current;
        }
        ppFVar8 = &(((pcVar11->IsNewLabel)._M_t.
                     super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>
                     .super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl)->
                   super_cmCursesWidget).Field;
        if (iVar10._M_current ==
            (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<fieldnode*,std::allocator<fieldnode*>>::_M_realloc_insert<fieldnode*const&>
                    (local_88,iVar10,ppFVar8);
          iVar10._M_current =
               (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
        }
        else {
          *iVar10._M_current = *ppFVar8;
          iVar10._M_current =
               (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
          (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar10._M_current;
        }
        ppFVar8 = &((pcVar11->Entry)._M_t.
                    super___uniq_ptr_impl<cmCursesWidget,_std::default_delete<cmCursesWidget>_>._M_t
                    .super__Tuple_impl<0UL,_cmCursesWidget_*,_std::default_delete<cmCursesWidget>_>.
                    super__Head_base<0UL,_cmCursesWidget_*,_false>._M_head_impl)->Field;
        if (iVar10._M_current ==
            (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<fieldnode*,std::allocator<fieldnode*>>::_M_realloc_insert<fieldnode*const&>
                    (local_88,iVar10,ppFVar8);
        }
        else {
          *iVar10._M_current = *ppFVar8;
          pppfVar1 = &(this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppfVar1 = *pppfVar1 + 1;
        }
      }
      pcVar11 = pcVar11 + 1;
    } while (pcVar11 != local_40);
  }
  ppfVar9 = (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar10._M_current =
       (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  this->IsEmpty = ppfVar9 == iVar10._M_current;
  if (ppfVar9 == iVar10._M_current) {
    __args = (fieldnode **)
             ((long)(((this->EmptyCacheEntry)._M_t.
                      super___uniq_ptr_impl<cmCursesCacheEntryComposite,_std::default_delete<cmCursesCacheEntryComposite>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCursesCacheEntryComposite_*,_std::default_delete<cmCursesCacheEntryComposite>_>
                      .super__Head_base<0UL,_cmCursesCacheEntryComposite_*,_false>._M_head_impl)->
                    Label)._M_t + 0x30);
    if (ppfVar9 ==
        (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<fieldnode*,std::allocator<fieldnode*>>::_M_realloc_insert<fieldnode*const&>
                (local_88,iVar10,__args);
      iVar10._M_current =
           (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      *iVar10._M_current = *__args;
      iVar10._M_current =
           (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar10._M_current;
    }
    ppfVar9 = (fieldnode **)
              ((long)(((this->EmptyCacheEntry)._M_t.
                       super___uniq_ptr_impl<cmCursesCacheEntryComposite,_std::default_delete<cmCursesCacheEntryComposite>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCursesCacheEntryComposite_*,_std::default_delete<cmCursesCacheEntryComposite>_>
                       .super__Head_base<0UL,_cmCursesCacheEntryComposite_*,_false>._M_head_impl)->
                     IsNewLabel)._M_t.
                     super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>
              + 0x30);
    if (iVar10._M_current ==
        (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<fieldnode*,std::allocator<fieldnode*>>::_M_realloc_insert<fieldnode*const&>
                (local_88,iVar10,ppfVar9);
      iVar10._M_current =
           (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      *iVar10._M_current = *ppfVar9;
      iVar10._M_current =
           (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar10._M_current;
    }
    ppfVar9 = (fieldnode **)
              ((long)(((this->EmptyCacheEntry)._M_t.
                       super___uniq_ptr_impl<cmCursesCacheEntryComposite,_std::default_delete<cmCursesCacheEntryComposite>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCursesCacheEntryComposite_*,_std::default_delete<cmCursesCacheEntryComposite>_>
                       .super__Head_base<0UL,_cmCursesCacheEntryComposite_*,_false>._M_head_impl)->
                     Entry)._M_t.
                     super___uniq_ptr_impl<cmCursesWidget,_std::default_delete<cmCursesWidget>_> +
              0x30);
    if (iVar10._M_current ==
        (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<fieldnode*,std::allocator<fieldnode*>>::_M_realloc_insert<fieldnode*const&>
                (local_88,iVar10,ppfVar9);
    }
    else {
      *iVar10._M_current = *ppfVar9;
      pppfVar1 = &(this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppfVar1 = *pppfVar1 + 1;
    }
    *local_38 = 1;
  }
  local_80._M_dataplus._M_p = (pointer)0x0;
  std::vector<fieldnode*,std::allocator<fieldnode*>>::emplace_back<fieldnode*>
            (local_88,(fieldnode **)&local_80);
  return;
}

Assistant:

void cmCursesMainForm::RePost()
{
  // Create the fields to be passed to the form.
  if (this->Form) {
    unpost_form(this->Form);
    free_form(this->Form);
    this->Form = nullptr;
  }
  this->Fields.clear();
  if (this->AdvancedMode) {
    this->NumberOfVisibleEntries = this->Entries.size();
  } else {
    // If normal mode, count only non-advanced entries
    this->NumberOfVisibleEntries = 0;
    for (cmCursesCacheEntryComposite& entry : this->Entries) {
      cmValue existingValue =
        this->CMakeInstance->GetState()->GetCacheEntryValue(entry.GetValue());
      bool advanced =
        this->CMakeInstance->GetState()->GetCacheEntryPropertyAsBool(
          entry.GetValue(), "ADVANCED");
      if (!existingValue || (!this->AdvancedMode && advanced)) {
        continue;
      }
      this->NumberOfVisibleEntries++;
    }
  }
  // there is always one even if it is the dummy one
  if (this->NumberOfVisibleEntries == 0) {
    this->NumberOfVisibleEntries = 1;
  }
  // Assign the fields: 3 for each entry: label, new entry marker
  // ('*' or ' ') and entry widget
  this->Fields.reserve(3 * this->NumberOfVisibleEntries + 1);

  // Assign fields
  for (cmCursesCacheEntryComposite& entry : this->Entries) {
    cmValue existingValue =
      this->CMakeInstance->GetState()->GetCacheEntryValue(entry.GetValue());
    bool advanced =
      this->CMakeInstance->GetState()->GetCacheEntryPropertyAsBool(
        entry.GetValue(), "ADVANCED");
    if (!existingValue || (!this->AdvancedMode && advanced)) {
      continue;
    }
    this->Fields.push_back(entry.Label->Field);
    this->Fields.push_back(entry.IsNewLabel->Field);
    this->Fields.push_back(entry.Entry->Field);
  }
  // if no cache entries there should still be one dummy field
  this->IsEmpty = this->Fields.empty();
  if (this->IsEmpty) {
    this->Fields.push_back(this->EmptyCacheEntry->Label->Field);
    this->Fields.push_back(this->EmptyCacheEntry->IsNewLabel->Field);
    this->Fields.push_back(this->EmptyCacheEntry->Entry->Field);
    this->NumberOfVisibleEntries = 1;
  }
  // Has to be null terminated.
  this->Fields.push_back(nullptr);
}